

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_syms.c
# Opt level: O1

_Bool gen_iosym(int K,int T,int n_ESIs,uint32_t *ESIs)

{
  uint uVar1;
  int iVar2;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  size_t sVar3;
  void *__ptr_02;
  undefined8 uVar4;
  undefined4 in_register_0000003c;
  char *pcVar5;
  byte bVar6;
  ulong uVar7;
  size_t sVar8;
  size_t prog_sz;
  size_t inter_sym_num;
  size_t work_sz;
  size_t local_48;
  long local_40;
  size_t local_38;
  
  uVar1 = RqInterGetMemSizes(CONCAT44(in_register_0000003c,K),0,0,0,&local_40);
  if (uVar1 == 0) {
    uVar1 = RqOutGetMemSizes(n_ESIs,&local_38,&local_48);
    if (uVar1 != 0) {
      pcVar5 = "RqOutGetMemSizes(n_ESIs, &work_sz, &prog_sz)";
      uVar4 = 0x7e;
      goto LAB_0010189a;
    }
    __ptr = malloc(local_38);
    __ptr_00 = malloc(local_48);
    uVar1 = RqOutInit(K,__ptr,local_38);
    if (uVar1 != 0) {
      pcVar5 = "RqOutInit(K, wrk, work_sz)";
      uVar4 = 0x82;
LAB_001018fe:
      __ptr_02 = (void *)0x0;
      fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
              ,uVar4,pcVar5,(ulong)uVar1);
      __ptr_01 = (void *)0x0;
      goto LAB_0010190b;
    }
    if (0 < n_ESIs) {
      uVar7 = 0;
      do {
        K = RqOutAddIds(__ptr,ESIs[uVar7],1);
        if (K != 0) {
          fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
                  ,0x84,"RqOutAddIds(wrk, ESIs[i], 1)",(ulong)(uint)K);
          iVar2 = 4;
          goto LAB_0010176e;
        }
        uVar7 = uVar7 + 1;
      } while ((uint)n_ESIs != uVar7);
    }
    iVar2 = 9;
LAB_0010176e:
    bVar6 = (byte)K;
    if (iVar2 == 4) {
      __ptr_02 = (void *)0x0;
      __ptr_01 = (void *)0x0;
      bVar6 = 0;
      goto LAB_0010190e;
    }
    if (iVar2 != 9) goto LAB_00101942;
    uVar1 = RqOutCompile(__ptr,__ptr_00,local_48);
    if (uVar1 != 0) {
      pcVar5 = "RqOutCompile(wrk, prog, prog_sz)";
      uVar4 = 0x85;
      goto LAB_001018fe;
    }
    sVar8 = local_40 * T;
    __ptr_01 = malloc(sVar8);
    sVar3 = fread(__ptr_01,1,sVar8,_stdin);
    if (sVar3 != sVar8) {
      gen_iosym_cold_1();
      __ptr_02 = (void *)0x0;
      goto LAB_0010190b;
    }
    sVar3 = (size_t)(n_ESIs * T);
    __ptr_02 = malloc(sVar3);
    uVar1 = RqOutExecute(__ptr_00,(long)T,__ptr_01,__ptr_02,sVar3);
    if (uVar1 == 0) {
      sVar8 = fwrite(__ptr_02,1,sVar3,_stdout);
      bVar6 = 1;
      if (sVar8 != sVar3) {
        gen_iosym_cold_2();
        goto LAB_0010190b;
      }
    }
    else {
      bVar6 = 0;
      fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
              ,0x93,"RqOutExecute(prog, T, indata, outdata, outdata_sz)",(ulong)uVar1);
    }
  }
  else {
    pcVar5 = "RqInterGetMemSizes(K, 0, ((void*)0), ((void*)0), &inter_sym_num)";
    uVar4 = 0x7b;
LAB_0010189a:
    __ptr_02 = (void *)0x0;
    fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
            ,uVar4,pcVar5,(ulong)uVar1);
    __ptr_01 = (void *)0x0;
    __ptr_00 = (void *)0x0;
    __ptr = (void *)0x0;
LAB_0010190b:
    bVar6 = 0;
  }
LAB_0010190e:
  if (__ptr_02 != (void *)0x0) {
    free(__ptr_02);
  }
  if (__ptr_01 != (void *)0x0) {
    free(__ptr_01);
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
LAB_00101942:
  return (_Bool)(bVar6 & 1);
}

Assistant:

bool gen_iosym(int K, int T, int n_ESIs, uint32_t* ESIs)
{
	bool success = false;

	RqOutWorkMem* wrk = NULL;
	RqOutProgram* prog = NULL;
	void* indata = NULL;
	void* outdata = NULL;

	size_t work_sz, prog_sz, inter_sym_num;
	RUN_NOFAIL(RqInterGetMemSizes(K, 0, NULL, NULL, &inter_sym_num), xit);
	RUN_NOFAIL(RqOutGetMemSizes(n_ESIs,
				&work_sz,
				&prog_sz), xit);
	wrk = malloc(work_sz);
	prog = malloc(prog_sz);

	RUN_NOFAIL(RqOutInit(K, wrk, work_sz), xit);
	for (int i = 0; i < n_ESIs; ++i)
		RUN_NOFAIL(RqOutAddIds(wrk, ESIs[i], 1), xit);
	RUN_NOFAIL(RqOutCompile(wrk, prog, prog_sz), xit);

	/* Read source data */
	size_t indata_sz = T * (size_t)inter_sym_num;
	indata = malloc(indata_sz);
	size_t ret = fread(indata, 1, indata_sz, stdin);
	if (ret != indata_sz) {
		fprintf(stderr, "Error:  fread() returned a short count.\n");
		goto xit;
	}

	/* Generate iblock data */
	size_t outdata_sz = T * n_ESIs;
	outdata = malloc(outdata_sz);
	RUN_NOFAIL(RqOutExecute(prog, T, indata, outdata, outdata_sz), xit);

	/* Print them to stdout */
	size_t out_written = fwrite(outdata, 1, outdata_sz, stdout);
	if (out_written != outdata_sz) {
		fprintf(stderr, "Error:  fwrite() returned a short count.\n");
		goto xit;
	}

	success = true;
xit:
	if (outdata)		free(outdata);
	if (indata)		free(indata);
	if (prog)		free(prog);
	if (wrk)		free(wrk);
	return success;
}